

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O2

Polynom<Complex> * __thiscall
Polynom<Complex>::operator%=(Polynom<Complex> *this,Polynom<Complex> *a)

{
  Matrix<Complex> local_20;
  
  operator%((Polynom<Complex> *)&local_20,this);
  Matrix<Complex>::operator=(&this->m,&local_20);
  Matrix<Complex>::~Matrix(&local_20);
  return this;
}

Assistant:

inline Polynom &operator%=(const Polynom &a)
    {
        return *this = *this % a;
    }